

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm.c
# Opt level: O1

double * inform_tpm(int *series,size_t n,size_t m,int b,double *tpm,inform_error *err)

{
  inform_error iVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  double *pdVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  double sum;
  double dVar12;
  
  if (series == (int *)0x0) {
    iVar1 = INFORM_ETIMESERIES;
  }
  else if (n == 0) {
    iVar1 = INFORM_ENOINITS;
  }
  else if (m < 2) {
    iVar1 = INFORM_ESHORTSERIES;
  }
  else {
    if (1 < b) {
      uVar2 = m * n;
      bVar10 = uVar2 != 0;
      if (bVar10) {
        uVar5 = 1;
        do {
          if (series[uVar5 - 1] < 0) {
            iVar1 = INFORM_ENEGSTATE;
LAB_0015e812:
            if (err != (inform_error *)0x0) {
              *err = iVar1;
            }
            break;
          }
          if (b <= series[uVar5 - 1]) {
            iVar1 = INFORM_EBADSTATE;
            goto LAB_0015e812;
          }
          bVar10 = uVar5 < uVar2;
          bVar11 = uVar5 != uVar2;
          uVar5 = uVar5 + 1;
        } while (bVar11);
      }
      if (bVar10) {
        return (double *)0x0;
      }
      uVar3 = b * b;
      if (tpm == (double *)0x0) {
        tpm = (double *)calloc((ulong)uVar3,8);
        if (tpm == (double *)0x0) {
          if (err != (inform_error *)0x0) {
            *err = INFORM_ENOMEM;
          }
          tpm = (double *)0x0;
        }
      }
      else {
        memset(tpm,0,(ulong)(uVar3 + (uVar3 == 0)) << 3);
      }
      if (tpm == (double *)0x0) {
        return (double *)0x0;
      }
      lVar4 = 0;
      do {
        if (m != 1) {
          sVar7 = 1;
          do {
            lVar9 = (long)series[sVar7] + (long)series[sVar7 - 1] * (long)b;
            tpm[lVar9] = tpm[lVar9] + 1.0;
            sVar7 = sVar7 + 1;
          } while (m != sVar7);
        }
        lVar4 = lVar4 + 1;
        series = series + m;
      } while (lVar4 != n + (n == 0));
      uVar2 = 1;
      if (1 < b) {
        uVar2 = (ulong)(uint)b;
      }
      uVar5 = 0;
      pdVar6 = tpm;
      do {
        uVar8 = 0;
        dVar12 = 0.0;
        do {
          dVar12 = dVar12 + pdVar6[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
        if ((dVar12 != 0.0) || (NAN(dVar12))) {
          uVar8 = 0;
          do {
            pdVar6[uVar8] = pdVar6[uVar8] / dVar12;
            uVar8 = uVar8 + 1;
          } while (uVar2 != uVar8);
        }
        else if (err != (inform_error *)0x0) {
          *err = INFORM_ETPMROW;
        }
        uVar5 = uVar5 + 1;
        pdVar6 = pdVar6 + (uint)b;
      } while (uVar5 != uVar2);
      return tpm;
    }
    iVar1 = INFORM_EBIN;
  }
  if (err != (inform_error *)0x0) {
    *err = iVar1;
  }
  return (double *)0x0;
}

Assistant:

double *inform_tpm(int const *series, size_t n, size_t m, int b, double *tpm,
    inform_error *err)
{
    if (check_arguments(series, n, m, b, err))
        return NULL;

    if ((tpm = setup_tpm(tpm, b, err)) == NULL)
        return NULL;

    int current = 0, future = 0;
    for (size_t i = 0; i < n; ++i)
    {
        for (size_t j = 0; j < m - 1; ++j)
        {
            current = series[m * i + j];
            future = series[m * i + j + 1];
            tpm[b * current + future] += 1;
        }
    }

    for (int i = 0; i < b; ++i)
    {
        double sum = 0.0;
        for (int j = 0; j < b; ++j)
            sum += tpm[b * i + j];

        if (sum != 0.0)
        {
            for (int j = 0; j < b; ++j)
            {
                tpm[b * i + j] /= sum;
            }
        }
        else
        {
            INFORM_ERROR(err, INFORM_ETPMROW);
        }
    }

    return tpm;
}